

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_rand.c
# Opt level: O0

int BN_rand(BIGNUM *rnd,int bits,int top,int bottom)

{
  int num;
  int iVar1;
  uchar *s;
  BIGNUM *pBVar2;
  undefined4 in_register_00000034;
  int bytes;
  int ret;
  uchar *buf;
  uint8_t *in_stack_ffffffffffffffd8;
  int iVar3;
  
  iVar3 = 0;
  num = (bits + 7) / 8;
  s = (uchar *)CRYPTO_malloc(num,(char *)CONCAT44(in_register_00000034,bits),(bits + 7) % 8);
  if (((s != (uchar *)0x0) && (iVar1 = RAND_buf(in_stack_ffffffffffffffd8,0), iVar1 != 0)) &&
     (pBVar2 = BN_bin2bn(s,num,rnd), pBVar2 != (BIGNUM *)0x0)) {
    iVar3 = 1;
  }
  CRYPTO_clear_free((void *)CONCAT44(iVar3,num),(size_t)in_stack_ffffffffffffffd8);
  return iVar3;
}

Assistant:

int BN_rand(BIGNUM *rnd, int bits)
{
    unsigned char *buf = NULL;
    int ret = 0, bytes;

    bytes = (bits + 7) / 8;
    buf = CRYPTO_malloc(bytes);
    if (buf == NULL) {
        //BNerr(BN_F_BNRAND, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    
    if(!RAND_buf(buf, bytes))
    {
        goto err;
    }

    if (!BN_bin2bn(buf, bytes, rnd))
    {
        goto err;
    }
    ret = 1;
err:
    CRYPTO_clear_free(buf, bytes);
    bn_check_top(rnd);
    return (ret);
}